

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_kernel_2.h
# Opt level: O0

void __thiscall
dlib::
memory_manager_kernel_2<dlib::stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>::node,_10UL>
::deallocate(memory_manager_kernel_2<dlib::stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>::node,_10UL>
             *this,node *item)

{
  undefined8 *in_RSI;
  long in_RDI;
  node *temp;
  
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -1;
  stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>
  ::node::~node((node *)0x363fbe);
  *in_RSI = *(undefined8 *)(in_RDI + 0x10);
  *(undefined8 **)(in_RDI + 0x10) = in_RSI;
  return;
}

Assistant:

void deallocate (
            T* item
        ) 
        { 
            --allocations;  
            item->~T();

            // add this memory into our linked list.
            node* temp = reinterpret_cast<node*>(item);
            temp->next = next;
            next = temp;                
        }